

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

const_iterator * __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::priv::(anonymous_namespace)::Hash,_phmap::priv::(anonymous_namespace)::Eq,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
::begin(const_iterator *__return_storage_ptr__,
       parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::priv::(anonymous_namespace)::Hash,_phmap::priv::(anonymous_namespace)::Eq,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       *this)

{
  char cVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [11];
  undefined1 auVar10 [12];
  undefined1 auVar11 [13];
  undefined1 auVar12 [14];
  const_iterator *extraout_RAX;
  uint uVar13;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  iterator it;
  iterator local_40;
  
  local_40.it_end_.ctrl_ = (this->sets_)._M_elems[0].set_.ctrl_;
  local_40.it_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)(this->sets_)._M_elems[0].set_.slots_;
  cVar1 = *local_40.it_end_.ctrl_;
  local_40.it_.ctrl_ = local_40.it_end_.ctrl_;
  while (cVar1 < -1) {
    iVar5 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                   CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
    iVar6 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                   CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
    iVar7 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                   CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
    iVar8 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                   CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
    in_XMM1_Ba = -(*local_40.it_.ctrl_ < (char)iVar5);
    in_XMM1_Bb = -(local_40.it_.ctrl_[1] < (char)((uint)iVar5 >> 8));
    in_XMM1_Bc = -(local_40.it_.ctrl_[2] < (char)((uint)iVar5 >> 0x10));
    in_XMM1_Bd = -(local_40.it_.ctrl_[3] < (char)((uint)iVar5 >> 0x18));
    in_XMM1_Be = -(local_40.it_.ctrl_[4] < (char)iVar6);
    in_XMM1_Bf = -(local_40.it_.ctrl_[5] < (char)((uint)iVar6 >> 8));
    in_XMM1_Bg = -(local_40.it_.ctrl_[6] < (char)((uint)iVar6 >> 0x10));
    in_XMM1_Bh = -(local_40.it_.ctrl_[7] < (char)((uint)iVar6 >> 0x18));
    in_XMM1_Bi = -(local_40.it_.ctrl_[8] < (char)iVar7);
    in_XMM1_Bj = -(local_40.it_.ctrl_[9] < (char)((uint)iVar7 >> 8));
    in_XMM1_Bk = -(local_40.it_.ctrl_[10] < (char)((uint)iVar7 >> 0x10));
    in_XMM1_Bl = -(local_40.it_.ctrl_[0xb] < (char)((uint)iVar7 >> 0x18));
    in_XMM1_Bm = -(local_40.it_.ctrl_[0xc] < (char)iVar8);
    in_XMM1_Bn = -(local_40.it_.ctrl_[0xd] < (char)((uint)iVar8 >> 8));
    in_XMM1_Bo = -(local_40.it_.ctrl_[0xe] < (char)((uint)iVar8 >> 0x10));
    in_XMM1_Bp = -(local_40.it_.ctrl_[0xf] < (char)((uint)iVar8 >> 0x18));
    auVar3[1] = in_XMM1_Bb;
    auVar3[0] = in_XMM1_Ba;
    auVar3[2] = in_XMM1_Bc;
    auVar3[3] = in_XMM1_Bd;
    auVar3[4] = in_XMM1_Be;
    auVar3[5] = in_XMM1_Bf;
    auVar3[6] = in_XMM1_Bg;
    auVar3[7] = in_XMM1_Bh;
    auVar3[8] = in_XMM1_Bi;
    auVar3[9] = in_XMM1_Bj;
    auVar3[10] = in_XMM1_Bk;
    auVar3[0xb] = in_XMM1_Bl;
    auVar3[0xc] = in_XMM1_Bm;
    auVar3[0xd] = in_XMM1_Bn;
    auVar3[0xe] = in_XMM1_Bo;
    auVar3[0xf] = in_XMM1_Bp;
    auVar4[1] = in_XMM1_Bb;
    auVar4[0] = in_XMM1_Ba;
    auVar4[2] = in_XMM1_Bc;
    auVar4[3] = in_XMM1_Bd;
    auVar4[4] = in_XMM1_Be;
    auVar4[5] = in_XMM1_Bf;
    auVar4[6] = in_XMM1_Bg;
    auVar4[7] = in_XMM1_Bh;
    auVar4[8] = in_XMM1_Bi;
    auVar4[9] = in_XMM1_Bj;
    auVar4[10] = in_XMM1_Bk;
    auVar4[0xb] = in_XMM1_Bl;
    auVar4[0xc] = in_XMM1_Bm;
    auVar4[0xd] = in_XMM1_Bn;
    auVar4[0xe] = in_XMM1_Bo;
    auVar4[0xf] = in_XMM1_Bp;
    auVar12[1] = in_XMM1_Bd;
    auVar12[0] = in_XMM1_Bc;
    auVar12[2] = in_XMM1_Be;
    auVar12[3] = in_XMM1_Bf;
    auVar12[4] = in_XMM1_Bg;
    auVar12[5] = in_XMM1_Bh;
    auVar12[6] = in_XMM1_Bi;
    auVar12[7] = in_XMM1_Bj;
    auVar12[8] = in_XMM1_Bk;
    auVar12[9] = in_XMM1_Bl;
    auVar12[10] = in_XMM1_Bm;
    auVar12[0xb] = in_XMM1_Bn;
    auVar12[0xc] = in_XMM1_Bo;
    auVar12[0xd] = in_XMM1_Bp;
    auVar11[1] = in_XMM1_Be;
    auVar11[0] = in_XMM1_Bd;
    auVar11[2] = in_XMM1_Bf;
    auVar11[3] = in_XMM1_Bg;
    auVar11[4] = in_XMM1_Bh;
    auVar11[5] = in_XMM1_Bi;
    auVar11[6] = in_XMM1_Bj;
    auVar11[7] = in_XMM1_Bk;
    auVar11[8] = in_XMM1_Bl;
    auVar11[9] = in_XMM1_Bm;
    auVar11[10] = in_XMM1_Bn;
    auVar11[0xb] = in_XMM1_Bo;
    auVar11[0xc] = in_XMM1_Bp;
    auVar10[1] = in_XMM1_Bf;
    auVar10[0] = in_XMM1_Be;
    auVar10[2] = in_XMM1_Bg;
    auVar10[3] = in_XMM1_Bh;
    auVar10[4] = in_XMM1_Bi;
    auVar10[5] = in_XMM1_Bj;
    auVar10[6] = in_XMM1_Bk;
    auVar10[7] = in_XMM1_Bl;
    auVar10[8] = in_XMM1_Bm;
    auVar10[9] = in_XMM1_Bn;
    auVar10[10] = in_XMM1_Bo;
    auVar10[0xb] = in_XMM1_Bp;
    auVar9[1] = in_XMM1_Bg;
    auVar9[0] = in_XMM1_Bf;
    auVar9[2] = in_XMM1_Bh;
    auVar9[3] = in_XMM1_Bi;
    auVar9[4] = in_XMM1_Bj;
    auVar9[5] = in_XMM1_Bk;
    auVar9[6] = in_XMM1_Bl;
    auVar9[7] = in_XMM1_Bm;
    auVar9[8] = in_XMM1_Bn;
    auVar9[9] = in_XMM1_Bo;
    auVar9[10] = in_XMM1_Bp;
    uVar13 = (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB141(auVar12 >> 7,0) & 1) << 2 |
                      (ushort)(SUB131(auVar11 >> 7,0) & 1) << 3 |
                      (ushort)(SUB121(auVar10 >> 7,0) & 1) << 4 |
                      (ushort)(SUB111(auVar9 >> 7,0) & 1) << 5 |
                      (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                               CONCAT18(in_XMM1_Bo,
                                                        CONCAT17(in_XMM1_Bn,
                                                                 CONCAT16(in_XMM1_Bm,
                                                                          CONCAT15(in_XMM1_Bl,
                                                                                   CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                      (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                               CONCAT17(in_XMM1_Bo,
                                                        CONCAT16(in_XMM1_Bn,
                                                                 CONCAT15(in_XMM1_Bm,
                                                                          CONCAT14(in_XMM1_Bl,
                                                                                   CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                     7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
    uVar2 = 0;
    if (uVar13 != 0) {
      for (; (uVar13 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
      }
    }
    local_40.it_.field_1.slot_ =
         (slot_type *)((long)local_40.it_.field_1.slot_ + (ulong)(uVar2 << 4));
    cVar1 = local_40.it_.ctrl_[uVar2];
    local_40.it_.ctrl_ = local_40.it_.ctrl_ + uVar2;
  }
  local_40.inner_end_ = (Inner *)(this + 1);
  local_40.it_end_.ctrl_ = local_40.it_end_.ctrl_ + (this->sets_)._M_elems[0].set_.capacity_;
  local_40.inner_ = (Inner *)this;
  iterator::skip_empty(&local_40);
  (__return_storage_ptr__->iter_).it_end_.ctrl_ = local_40.it_end_.ctrl_;
  (__return_storage_ptr__->iter_).it_end_.field_1 = local_40.it_end_.field_1;
  (__return_storage_ptr__->iter_).it_.ctrl_ = local_40.it_.ctrl_;
  (__return_storage_ptr__->iter_).it_.field_1.slot_ = (slot_type *)local_40.it_.field_1;
  (__return_storage_ptr__->iter_).inner_ = local_40.inner_;
  (__return_storage_ptr__->iter_).inner_end_ = local_40.inner_end_;
  return extraout_RAX;
}

Assistant:

const_iterator begin()  const { return const_cast<parallel_hash_set *>(this)->begin(); }